

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

float stbir__filter_triangle(float x,float s,void *user_data)

{
  void *user_data_local;
  undefined4 local_10;
  float s_local;
  float x_local;
  
  local_10 = x;
  if (x < 0.0) {
    local_10 = -x;
  }
  if (1.0 < local_10) {
    s_local = 0.0;
  }
  else {
    s_local = 1.0 - local_10;
  }
  return s_local;
}

Assistant:

static float stbir__filter_triangle(float x, float s, void * user_data)
{
  STBIR__UNUSED(s);
  STBIR__UNUSED(user_data);

  if ( x < 0.0f ) x = -x;

  if (x <= 1.0f)
    return 1.0f - x;
  else
    return 0.0f;
}